

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

field_t * __thiscall
cfgfile::generator::cfg::tag_base_class_t::cfg
          (field_t *__return_storage_ptr__,tag_base_class_t *this)

{
  tag_t<cfgfile::string_trait_t> *ptVar1;
  long lVar2;
  pos_t pVar3;
  undefined8 uVar4;
  bool bVar5;
  field_type_t fVar6;
  undefined8 extraout_RAX;
  long column_number;
  long line_number;
  undefined1 local_50 [32];
  
  __return_storage_ptr__->m_type = unknown_field_type;
  (__return_storage_ptr__->m_value_type)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_value_type).field_2;
  (__return_storage_ptr__->m_value_type)._M_string_length = 0;
  (__return_storage_ptr__->m_value_type).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_constraint).
  super___shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>)0x0;
  *(undefined4 *)&__return_storage_ptr__->m_line_number = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->m_line_number + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->m_column_number = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->m_column_number + 4) = 0xffffffff;
  __return_storage_ptr__->m_is_required = false;
  (__return_storage_ptr__->m_default_value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_default_value).field_2;
  (__return_storage_ptr__->m_default_value)._M_string_length = 0;
  (__return_storage_ptr__->m_default_value).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->m_is_base = true;
  fVar6 = field_type_from_string
                    ((cfg *)(this->
                            super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                            ).m_value._M_dataplus._M_p,
                     (string *)
                     (this->
                     super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                     ).m_value._M_string_length);
  __return_storage_ptr__->m_type = fVar6;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_name);
  pVar3 = (this->
          super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
          ).super_tag_t<cfgfile::string_trait_t>.m_column_number;
  __return_storage_ptr__->m_line_number =
       (this->
       super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       ).super_tag_t<cfgfile::string_trait_t>.m_line_number;
  __return_storage_ptr__->m_column_number = pVar3;
  bVar5 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_value_type).super_tag_t<cfgfile::string_trait_t>);
  if (bVar5) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_value_type);
  }
  bVar5 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_is_required).super_tag_t<cfgfile::string_trait_t>);
  if (bVar5) {
    __return_storage_ptr__->m_is_required = true;
  }
  bVar5 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_default_value).super_tag_t<cfgfile::string_trait_t>);
  if (bVar5) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_default_value);
  }
  ptVar1 = (this->
           super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
           ).super_tag_t<cfgfile::string_trait_t>.m_parent;
  bVar5 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)&this->m_min_max_constraint);
  if ((bVar5) &&
     (bVar5 = tag_t<cfgfile::string_trait_t>::is_defined
                        ((tag_t<cfgfile::string_trait_t> *)&this->m_one_of_constraint), bVar5)) {
    line_number = (this->m_min_max_constraint).super_tag_no_value_t<cfgfile::string_trait_t>.
                  super_tag_t<cfgfile::string_trait_t>.m_line_number;
    lVar2 = (this->m_one_of_constraint).
            super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            .super_tag_t<cfgfile::string_trait_t>.m_line_number;
    if (line_number == lVar2) {
      lVar2 = (this->m_min_max_constraint).super_tag_no_value_t<cfgfile::string_trait_t>.
              super_tag_t<cfgfile::string_trait_t>.m_column_number;
      column_number =
           (this->m_one_of_constraint).
           super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
           .super_tag_t<cfgfile::string_trait_t>.m_column_number;
      if (column_number < lVar2) {
        column_number = lVar2;
      }
    }
    else if (lVar2 < line_number) {
      column_number =
           (this->m_min_max_constraint).super_tag_no_value_t<cfgfile::string_trait_t>.
           super_tag_t<cfgfile::string_trait_t>.m_column_number;
    }
    else {
      column_number =
           (this->m_one_of_constraint).
           super_tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
           .super_tag_t<cfgfile::string_trait_t>.m_column_number;
      line_number = lVar2;
    }
    throw_constraint_redefinition(&ptVar1->m_name,&(this->m_name).m_value,line_number,column_number)
    ;
    field_t::~field_t(__return_storage_ptr__);
    _Unwind_Resume(extraout_RAX);
  }
  bVar5 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)&this->m_min_max_constraint);
  if (bVar5) {
    tag_min_max_constraint_t::cfg((tag_min_max_constraint_t *)local_50);
  }
  else {
    bVar5 = tag_t<cfgfile::string_trait_t>::is_defined
                      ((tag_t<cfgfile::string_trait_t> *)&this->m_one_of_constraint);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    tag_one_of_constraint_t::cfg((tag_one_of_constraint_t *)local_50);
  }
  uVar4 = local_50._0_8_;
  local_50._16_8_ = local_50._0_8_;
  local_50._24_8_ = local_50._8_8_;
  local_50._0_16_ = (undefined1  [16])0x0;
  (__return_storage_ptr__->m_constraint).
  super___shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->m_constraint).
              super___shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

field_t
tag_base_class_t::cfg() const
{
	field_t f;
	f.set_base( true );
	f.set_type( field_type_from_string( value() ) );
	f.set_name( m_name.value() );
	f.set_line_number( line_number() );
	f.set_column_number( column_number() );

	if( m_value_type.is_defined() )
		f.set_value_type( m_value_type.value() );

	if( m_is_required.is_defined() )
		f.set_required();

	if( m_default_value.is_defined() )
		f.set_default_value( m_default_value.value() );

	const tag_class_t * c = static_cast< const tag_class_t* > ( parent() );

	check_constraints( m_min_max_constraint, m_one_of_constraint,
		c->name(), m_name.value() );

	if( m_min_max_constraint.is_defined() )
		f.set_constraint( m_min_max_constraint.cfg() );
	else if( m_one_of_constraint.is_defined() )
		f.set_constraint( m_one_of_constraint.cfg() );

	return f;
}